

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O3

stringc * __thiscall
irr::scene::CXMeshFileLoader::getNextToken(stringc *__return_storage_ptr__,CXMeshFileLoader *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  byte *pbVar7;
  int iVar8;
  long lVar9;
  int *c;
  char *c_00;
  uint length;
  u32 length_00;
  stringc s;
  stringc local_70;
  string<char> local_50;
  
  paVar2 = &local_70.str.field_2;
  local_70.str._M_string_length = 0;
  local_70.str.field_2._M_local_buf[0] = '\0';
  local_70.str._M_dataplus._M_p = (pointer)paVar2;
  if (this->BinaryFormat != true) {
    findNextNoneWhiteSpace(this);
    pbVar7 = *(byte **)&(this->super_IMeshLoader).field_0x18;
    if (pbVar7 < this->End) {
      do {
        bVar3 = *pbVar7;
        uVar6 = (ulong)bVar3;
        if (uVar6 < 0x3c) {
          if ((0x100003e00U >> (uVar6 & 0x3f) & 1) == 0) {
            if ((0x800100000000000U >> (uVar6 & 0x3f) & 1) == 0) goto LAB_001b7d65;
LAB_001b7d9a:
            if ((int)local_70.str._M_string_length == 0) {
              ::std::__cxx11::string::_M_replace_aux
                        ((ulong)&local_70,local_70.str._M_string_length,0,'\x01');
              puVar1 = &(this->super_IMeshLoader).field_0x18;
              *(long *)puVar1 = *(long *)puVar1 + 1;
            }
          }
          break;
        }
LAB_001b7d65:
        if ((bVar3 == 0x7d) || (bVar3 == 0x7b)) goto LAB_001b7d9a;
        ::std::__cxx11::string::_M_replace_aux
                  ((ulong)&local_70,local_70.str._M_string_length,0,'\x01');
        pbVar7 = (byte *)(*(long *)&(this->super_IMeshLoader).field_0x18 + 1);
        *(byte **)&(this->super_IMeshLoader).field_0x18 = pbVar7;
      } while (pbVar7 < this->End);
    }
switchD_001b7ca5_caseD_4:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    goto joined_r0x001b7dd7;
  }
  piVar4 = *(int **)&(this->super_IMeshLoader).field_0x18;
  piVar5 = (int *)this->End;
  if (piVar5 <= piVar4) goto switchD_001b7ca5_caseD_4;
  iVar8 = *piVar4;
  c = (int *)((long)piVar4 + 2);
  *(int **)&(this->super_IMeshLoader).field_0x18 = c;
  switch((short)iVar8) {
  case 1:
    length = 0;
    if (c < piVar5) {
      length = *(uint *)((long)piVar4 + 2);
      c = (int *)((long)piVar4 + 6);
      *(int **)&(this->super_IMeshLoader).field_0x18 = c;
    }
    core::string<char>::string<char>(&local_50,(char *)c,length);
    ::std::__cxx11::string::_M_assign((string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
      operator_delete(local_50.str._M_dataplus._M_p,local_50.str.field_2._M_allocated_capacity + 1);
    }
    puVar1 = &(this->super_IMeshLoader).field_0x18;
    *(ulong *)puVar1 = *(long *)puVar1 + (ulong)length;
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    goto joined_r0x001b7dd7;
  case 2:
    length_00 = 0;
    if (c < piVar5) {
      length_00 = *(u32 *)((long)piVar4 + 2);
      c = (int *)((long)piVar4 + 6);
      *(int **)&(this->super_IMeshLoader).field_0x18 = c;
    }
    core::string<char>::string<char>(&local_50,(char *)c,length_00);
    ::std::__cxx11::string::_M_assign((string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
      operator_delete(local_50.str._M_dataplus._M_p,local_50.str.field_2._M_allocated_capacity + 1);
    }
    puVar1 = &(this->super_IMeshLoader).field_0x18;
    *(ulong *)puVar1 = *(long *)puVar1 + (ulong)(length_00 + 2);
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
joined_r0x001b7dd7:
    if (&local_70 != __return_storage_ptr__) {
      ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
    goto LAB_001b8251;
  case 3:
    *(undefined2 **)&(this->super_IMeshLoader).field_0x18 = (undefined2 *)((long)piVar4 + 6);
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "<integer>";
    break;
  default:
    goto switchD_001b7ca5_caseD_4;
  case 5:
    *(undefined2 **)&(this->super_IMeshLoader).field_0x18 = (undefined2 *)((long)piVar4 + 0x12);
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "<guid>";
    break;
  case 6:
    if (c < piVar5) {
      uVar6 = (ulong)(uint)(*c << 2);
      lVar9 = 6;
    }
    else {
      lVar9 = 2;
      uVar6 = 0;
    }
    *(ulong *)&(this->super_IMeshLoader).field_0x18 = (long)piVar4 + lVar9 + uVar6;
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "<int_list>";
    break;
  case 7:
    if (c < piVar5) {
      iVar8 = *c;
      lVar9 = 6;
    }
    else {
      iVar8 = 0;
      lVar9 = 2;
    }
    *(ulong *)&(this->super_IMeshLoader).field_0x18 =
         (long)piVar4 + (ulong)(uint)(this->FloatSize * iVar8) + lVar9;
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "<flt_list>";
    break;
  case 10:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "{";
    break;
  case 0xb:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "}";
    break;
  case 0xc:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "(";
    break;
  case 0xd:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = ")";
    break;
  case 0xe:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "[";
    break;
  case 0xf:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "]";
    break;
  case 0x10:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "<";
    break;
  case 0x11:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = ">";
    break;
  case 0x12:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = ".";
    break;
  case 0x13:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = ",";
    break;
  case 0x14:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = ";";
    break;
  case 0x1f:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "template";
    break;
  case 0x28:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "WORD";
    break;
  case 0x29:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "DWORD";
    break;
  case 0x2a:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "FLOAT";
    break;
  case 0x2b:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "DOUBLE";
    break;
  case 0x2c:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "CHAR";
    break;
  case 0x2d:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "UCHAR";
    break;
  case 0x2e:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "SWORD";
    break;
  case 0x2f:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "SDWORD";
    break;
  case 0x30:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "void";
    break;
  case 0x31:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "string";
    break;
  case 0x32:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "unicode";
    break;
  case 0x33:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "cstring";
    break;
  case 0x34:
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    c_00 = "array";
  }
  core::string<char>::operator=(__return_storage_ptr__,c_00);
LAB_001b8251:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.str._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.str._M_dataplus._M_p,
                    CONCAT71(local_70.str.field_2._M_allocated_capacity._1_7_,
                             local_70.str.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

core::stringc CXMeshFileLoader::getNextToken()
{
	core::stringc s;

	// process binary-formatted file
	if (BinaryFormat) {
		// in binary mode it will only return NAME and STRING token
		// and (correctly) skip over other tokens.

		s16 tok = readBinWord();
		u32 len;

		// standalone tokens
		switch (tok) {
		case 1:
			// name token
			len = readBinDWord();
			s = core::stringc(P, len);
			P += len;
			return s;
		case 2:
			// string token
			len = readBinDWord();
			s = core::stringc(P, len);
			P += (len + 2);
			return s;
		case 3:
			// integer token
			P += 4;
			return "<integer>";
		case 5:
			// GUID token
			P += 16;
			return "<guid>";
		case 6:
			len = readBinDWord();
			P += (len * 4);
			return "<int_list>";
		case 7:
			len = readBinDWord();
			P += (len * FloatSize);
			return "<flt_list>";
		case 0x0a:
			return "{";
		case 0x0b:
			return "}";
		case 0x0c:
			return "(";
		case 0x0d:
			return ")";
		case 0x0e:
			return "[";
		case 0x0f:
			return "]";
		case 0x10:
			return "<";
		case 0x11:
			return ">";
		case 0x12:
			return ".";
		case 0x13:
			return ",";
		case 0x14:
			return ";";
		case 0x1f:
			return "template";
		case 0x28:
			return "WORD";
		case 0x29:
			return "DWORD";
		case 0x2a:
			return "FLOAT";
		case 0x2b:
			return "DOUBLE";
		case 0x2c:
			return "CHAR";
		case 0x2d:
			return "UCHAR";
		case 0x2e:
			return "SWORD";
		case 0x2f:
			return "SDWORD";
		case 0x30:
			return "void";
		case 0x31:
			return "string";
		case 0x32:
			return "unicode";
		case 0x33:
			return "cstring";
		case 0x34:
			return "array";
		}
	}
	// process text-formatted file
	else {
		findNextNoneWhiteSpace();

		if (P >= End)
			return s;

		while ((P < End) && !core::isspace(P[0])) {
			// either keep token delimiters when already holding a token, or return if first valid char
			if (P[0] == ';' || P[0] == '}' || P[0] == '{' || P[0] == ',') {
				if (!s.size()) {
					s.append(P[0]);
					++P;
				}
				break; // stop for delimiter
			}
			s.append(P[0]);
			++P;
		}
	}
	return s;
}